

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::dispatch_request(Server *this,Request *req,Response *res,Handlers *handlers)

{
  pointer ppVar1;
  bool bVar2;
  pointer __re;
  
  __re = (handlers->
         super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (handlers->
           super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__re == ppVar1) {
LAB_0013a69d:
      return __re != ppVar1;
    }
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&req->path,&req->matches,&__re->first,0);
    if (bVar2) {
      std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
                (&__re->second,req,res);
      goto LAB_0013a69d;
    }
    __re = __re + 1;
  } while( true );
}

Assistant:

inline bool Server::dispatch_request(Request &req, Response &res,
                                     const Handlers &handlers) {
  for (const auto &x : handlers) {
    const auto &pattern = x.first;
    const auto &handler = x.second;

    if (std::regex_match(req.path, req.matches, pattern)) {
      handler(req, res);
      return true;
    }
  }
  return false;
}